

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdi::ControllerWidget::ControllerWidget(ControllerWidget *this,QWidget *parent)

{
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f6248;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__ControllerWidget_007f63f8;
  this->activeControl = SC_None;
  this->hoverControl = SC_None;
  (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = 0;
  QWidget::setFocusPolicy(&this->super_QWidget,NoFocus);
  QWidget::setSizePolicy(&this->super_QWidget,(QSizePolicy)0x110000);
  QWidget::setAttribute(&this->super_QWidget,WA_MouseTracking,true);
  return;
}

Assistant:

ControllerWidget::ControllerWidget(QWidget *parent)
    : QWidget(parent),
      activeControl(QStyle::SC_None),
      hoverControl(QStyle::SC_None),
      visibleControls(QStyle::SC_None)
{
    setFocusPolicy(Qt::NoFocus);
    setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum);
    setMouseTracking(true);
}